

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSha1.c
# Opt level: O2

void deSha1_render(deSha1 *hash,char *buffer)

{
  char cVar1;
  byte bVar2;
  ulong uVar3;
  char cVar4;
  uint uVar5;
  
  bVar2 = 0;
  for (uVar3 = 0; uVar3 != 0x28; uVar3 = uVar3 + 1) {
    uVar5 = hash->hash[uVar3 >> 3] >> (~bVar2 & 0x1c) & 0xf;
    cVar1 = (char)uVar5;
    cVar4 = cVar1 + 'W';
    if (uVar5 < 10) {
      cVar4 = cVar1 + '0';
    }
    buffer[uVar3] = cVar4;
    bVar2 = bVar2 + 4;
  }
  return;
}

Assistant:

void deSha1_render (const deSha1* hash, char* buffer)
{
	size_t charNdx;

	for (charNdx = 0; charNdx < 40; charNdx++)
	{
		const deUint32	val32	= hash->hash[charNdx / 8];
		const deUint8	val8	= (deUint8)(0x0fu & (val32 >> (4 * (8 - 1 - (charNdx % 8)))));

		if (val8 < 10)
			buffer[charNdx] = (char)('0' + val8);
		else
			buffer[charNdx] = (char)('a' + val8 - 10);
	}
}